

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void xml_string_copy(xml_string *string,uint8_t *buffer,size_t length)

{
  if (string != (xml_string *)0x0) {
    if (string->length < length) {
      length = string->length;
    }
    memcpy(buffer,string->buffer,length);
    return;
  }
  return;
}

Assistant:

void xml_string_copy(struct xml_string* string, uint8_t* buffer, size_t length) {
	if (!string) {
		return;
	}

	#define min(X,Y) ((X) < (Y) ? (X) : (Y))
	length = min(length, string->length);
	#undef min

	memcpy(buffer, string->buffer, length);
}